

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

int ReadVarInt<DataStream,(VarIntMode)1,int>(DataStream *is)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  do {
    bVar2 = ser_readdata8<DataStream>(is);
    if (0xffffff < iVar4) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"ReadVarInt(): size too large");
LAB_001e8ef9:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_001e8f4c:
      __stack_chk_fail();
    }
    uVar3 = (uint)(bVar2 & 0x7f) | iVar4 << 7;
    if (-1 < (char)bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return uVar3;
      }
      goto LAB_001e8f4c;
    }
    if (uVar3 == 0x7fffffff) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"ReadVarInt(): size too large");
      goto LAB_001e8ef9;
    }
    iVar4 = uVar3 + 1;
  } while( true );
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}